

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hpp
# Opt level: O3

void __thiscall
crsGA::
Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
::~Population(Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
              *this)

{
  ThreadSafeQueue<std::function<void_()>_> *this_00;
  pointer pSVar1;
  pointer pSVar2;
  pointer this_01;
  
  LOCK();
  (this->_threadPool).stop._M_base._M_i = true;
  UNLOCK();
  this_00 = &(this->_threadPool).tasks;
  ThreadSafeQueue<std::function<void_()>_>::notify_and_terminate(this_00);
  pSVar1 = (this->_threadPool).workers.
           super__Vector_base<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (this->_threadPool).workers.
           super__Vector_base<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_01 = pSVar1;
  if (pSVar2 != pSVar1) {
    do {
      ScopedThread::~ScopedThread(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != pSVar2);
    (this->_threadPool).workers.
    super__Vector_base<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar1;
  }
  std::vector<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>::~vector
            (&(this->_threadPool).workers);
  std::condition_variable::~condition_variable(&(this->_threadPool).tasks._data_cond);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)this_00);
  std::
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::~vector(&this->_chromosomes);
  return;
}

Assistant:

~Population() {}